

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat R_y(double Angle)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double *extraout_RDX;
  Mat *in_RDI;
  Mat MVar4;
  undefined4 local_28;
  undefined4 uStack_24;
  
  dVar2 = cos(Angle);
  dVar3 = sin(Angle);
  Mat::Mat(in_RDI,3,3);
  pdVar1 = in_RDI->v_;
  *pdVar1 = dVar2;
  pdVar1[1] = 0.0;
  local_28 = SUB84(dVar3,0);
  uStack_24 = (undefined4)((ulong)dVar3 >> 0x20);
  pdVar1[2] = -dVar3;
  *(undefined4 *)(pdVar1 + 3) = 0;
  *(undefined4 *)((long)pdVar1 + 0x1c) = 0;
  *(undefined4 *)(pdVar1 + 4) = 0;
  *(undefined4 *)((long)pdVar1 + 0x24) = 0x3ff00000;
  pdVar1[5] = 0.0;
  *(undefined4 *)(pdVar1 + 6) = local_28;
  *(undefined4 *)((long)pdVar1 + 0x34) = uStack_24;
  pdVar1[7] = 0.0;
  pdVar1[8] = dVar2;
  MVar4.v_ = extraout_RDX;
  MVar4._0_8_ = in_RDI;
  return MVar4;
}

Assistant:

Mat R_y(double Angle)
{
	const double C = cos(Angle);
	const double S = sin(Angle);
	Mat U(3,3);
	U.v_[0] =  +C;
	U.v_[1] = 0.0;
	U.v_[2] =  -S;
	U.v_[3] = 0.0;
	U.v_[4] = 1.0;
	U.v_[5] = 0.0;
	U.v_[6] =  +S;
	U.v_[7] = 0.0;
	U.v_[8] =  +C;
	return U;
}